

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O2

sljit_s32 sljit_emit_op2(sljit_compiler *compiler,sljit_s32 op,sljit_s32 dst,sljit_sw dstw,
                        sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  uint uVar1;
  int iVar2;
  sljit_s32 sVar3;
  undefined1 *puVar4;
  sljit_u8 *psVar5;
  sljit_sw sVar6;
  uint set_flags;
  sljit_sw sVar7;
  sljit_u8 sVar8;
  sljit_u32 sVar9;
  int iVar10;
  sljit_s32 sVar11;
  
  if (compiler->error != 0) {
    return compiler->error;
  }
  uVar1 = op & 0x100;
  compiler->mode32 = uVar1;
  set_flags = op & 0xfe00;
  sVar11 = 0;
  if (set_flags == 0 && dst == 0) {
    return 0;
  }
  iVar10 = (int)src1w;
  iVar2 = (int)src2w;
  switch(op & 0xffff00ff) {
  case 0x60:
    if ((set_flags == 0) &&
       (sVar11 = emit_lea_binary(compiler,dst,dstw,src1,src1w,src2,src2w), sVar11 != 4))
    goto LAB_00136cf1;
    sVar9 = 0x5030100;
    break;
  case 0x61:
    sVar9 = 0x15131110;
    break;
  case 0x62:
    if (((src2 & 0x40U) != 0 && set_flags == 0) &&
       (sVar11 = emit_lea_binary(compiler,dst,dstw,src1,src1w,0x40,-src2w), sVar11 != 4))
    goto LAB_00136cf1;
    if (dst == 0) {
      sVar11 = emit_cmp_binary(compiler,src1,src1w,src2,src2w);
      return sVar11;
    }
    sVar9 = 0x2d2b2928;
    goto LAB_00136b27;
  case 99:
    sVar9 = 0x1d1b1918;
LAB_00136b27:
    sVar11 = emit_non_cum_binary(compiler,sVar9,dst,dstw,src1,src1w,src2,src2w);
    return sVar11;
  case 100:
    uVar1 = 0xf;
    if (dst - 1U < 0x3f) {
      uVar1 = dst;
    }
    if ((src2 & 0x40U) == 0 && uVar1 == src1) {
LAB_00136a9d:
      psVar5 = emit_x86_instruction(compiler,2,src1,0,src2,src2w);
joined_r0x00136bff:
      if (psVar5 == (sljit_u8 *)0x0) goto LAB_00136cf1;
      psVar5[0] = '\x0f';
      psVar5[1] = 0xaf;
    }
    else {
      if ((src1 & 0x40U) == 0 && uVar1 == src2) {
LAB_00136bf7:
        psVar5 = emit_x86_instruction(compiler,2,src2,0,src1,src1w);
        goto joined_r0x00136bff;
      }
      if ((src1 & 0x40U) == 0) {
        if ((src2 & 0x40U) == 0) {
          if (((char)src2 < '\0') &&
             (((src2 & 0x3fU) == uVar1 || (((uint)src2 >> 8 & 0x3f) == uVar1)))) {
            uVar1 = 0xf;
          }
          sVar11 = emit_mov(compiler,uVar1,0,src1,src1w);
          src1 = uVar1;
          if (sVar11 != 0) goto LAB_00136cf1;
          goto LAB_00136a9d;
        }
        if ((char)src2w == src2w) {
          psVar5 = emit_x86_instruction(compiler,1,uVar1,0,src1,src1w);
          if (psVar5 == (sljit_u8 *)0x0) goto LAB_00136cf1;
          *psVar5 = 'k';
          puVar4 = (undefined1 *)ensure_buf(compiler,2);
          if (puVar4 == (undefined1 *)0x0) goto LAB_00136cf1;
          *puVar4 = 1;
          compiler->size = compiler->size + 1;
          puVar4[1] = (char)src2w;
        }
        else {
          if (iVar2 != src2w) {
            sVar7 = src2w;
            if (uVar1 != src1) {
              iVar2 = emit_mov(compiler,uVar1,0,src1,src1w);
              goto joined_r0x00137061;
            }
            goto LAB_0013713d;
          }
          psVar5 = emit_x86_instruction(compiler,1,uVar1,0,src1,src1w);
          if (psVar5 == (sljit_u8 *)0x0) goto LAB_00136cf1;
          *psVar5 = 'i';
          puVar4 = (undefined1 *)ensure_buf(compiler,5);
          if (puVar4 == (undefined1 *)0x0) goto LAB_00136cf1;
          *puVar4 = 4;
          compiler->size = compiler->size + 4;
          *(int *)(puVar4 + 1) = iVar2;
        }
      }
      else {
        if ((src2 & 0x40U) != 0) {
          sVar11 = emit_mov(compiler,uVar1,0,0x40,src2w);
          src2w = 0;
          src2 = uVar1;
          if (sVar11 != 0) goto LAB_00136cf1;
        }
        if ((char)src1w == src1w) {
          psVar5 = emit_x86_instruction(compiler,1,uVar1,0,src2,src2w);
          if (psVar5 == (sljit_u8 *)0x0) goto LAB_00136cf1;
          *psVar5 = 'k';
          puVar4 = (undefined1 *)ensure_buf(compiler,2);
          if (puVar4 == (undefined1 *)0x0) goto LAB_00136cf1;
          *puVar4 = 1;
          compiler->size = compiler->size + 1;
          puVar4[1] = (char)src1w;
        }
        else {
          if (iVar10 != src1w) {
            sVar7 = src1w;
            if (uVar1 != src2) {
              iVar2 = emit_mov(compiler,uVar1,0,src2,src2w);
joined_r0x00137061:
              if (iVar2 != 0) goto LAB_00136cf1;
            }
LAB_0013713d:
            sVar11 = emit_load_imm64(compiler,0x10,sVar7);
            if (sVar11 != 0) goto LAB_00136cf1;
            src1 = 0x10;
            src1w = 0;
            src2 = uVar1;
            goto LAB_00136bf7;
          }
          psVar5 = emit_x86_instruction(compiler,1,uVar1,0,src2,src2w);
          if (psVar5 == (sljit_u8 *)0x0) goto LAB_00136cf1;
          *psVar5 = 'i';
          puVar4 = (undefined1 *)ensure_buf(compiler,5);
          if (puVar4 == (undefined1 *)0x0) goto LAB_00136cf1;
          *puVar4 = 4;
          compiler->size = compiler->size + 4;
          *(int *)(puVar4 + 1) = iVar10;
        }
      }
    }
    if (-1 < (char)dst) {
      return 0;
    }
    iVar2 = emit_mov(compiler,dst,dstw,0xf,0);
LAB_00136ce9:
    if (iVar2 == 0) {
      return 0;
    }
LAB_00136cf1:
    return compiler->error;
  case 0x65:
    if (dst == 0) {
      if (((((src2 & 0x40U) == 0) || (src1 != 1)) || (0xfffffffffffffeff < src2w - 0x80U)) ||
         (uVar1 == 0 && iVar2 != src2w)) {
        sVar7 = src2w;
        sVar11 = src2;
        if ((((src1 & 0x40U) == 0) || (src2 != 1)) || (0xfffffffffffffeff < src1w - 0x80U)) {
          sVar6 = src2w;
          if ((src1 & 0x40U) == 0) {
            if ((src2 & 0x40U) == 0) {
              sVar3 = src1;
              if ((0x3f < src1) && (sVar7 = src1w, sVar3 = src2, sVar11 = src1, 0x3f < src2))
              goto LAB_00136d86;
            }
            else {
              sVar7 = src1w;
              src2 = src1;
              if (uVar1 != 0 || iVar2 == src2w) {
LAB_001370ae:
                psVar5 = emit_x86_instruction(compiler,1,0x40,sVar6,src2,sVar7);
                if (psVar5 != (sljit_u8 *)0x0) {
                  *psVar5 = 0xf7;
                  return 0;
                }
                goto LAB_00136cf1;
              }
              sVar11 = emit_load_imm64(compiler,0xf,src2w);
              if (sVar11 != 0) goto LAB_00136cf1;
              sVar3 = 0xf;
              sVar11 = src1;
            }
          }
          else {
            if ((src2 & 0x40U) == 0) {
              sVar6 = src1w;
              if (uVar1 != 0 || iVar10 == src1w) goto LAB_001370ae;
              goto LAB_00136f86;
            }
LAB_00136d86:
            sVar11 = emit_mov(compiler,0xf,0,src1,src1w);
            if (sVar11 != 0) goto LAB_00136cf1;
            if ((src2 & 0x40U) == 0) {
              sVar7 = src2w;
              sVar3 = 0xf;
              sVar11 = src2;
            }
            else {
              if ((iVar2 == src2w) || (compiler->mode32 != 0)) {
                src2 = 0xf;
                sVar7 = 0;
                goto LAB_001370ae;
              }
              sVar11 = emit_load_imm64(compiler,0x10,src2w);
              if (sVar11 != 0) goto LAB_00136cf1;
              sVar7 = 0;
              sVar3 = 0x10;
              sVar11 = 0xf;
            }
          }
        }
        else {
          if (uVar1 != 0 || iVar10 == src1w) {
            sVar8 = 'H';
            if (uVar1 != 0) {
              sVar8 = '\0';
            }
            goto LAB_00136ce4;
          }
LAB_00136f86:
          sVar3 = emit_load_imm64(compiler,0xf,src1w);
          if (sVar3 != 0) goto LAB_00136cf1;
          sVar3 = 0xf;
        }
        psVar5 = emit_x86_instruction(compiler,1,sVar3,0,sVar11,sVar7);
        if (psVar5 != (sljit_u8 *)0x0) {
          *psVar5 = 0x85;
          return 0;
        }
        goto LAB_00136cf1;
      }
      sVar8 = 'H';
      src1w = src2w;
      if (uVar1 != 0) {
        sVar8 = '\0';
      }
LAB_00136ce4:
      iVar2 = emit_do_imm32(compiler,sVar8,0xa9,src1w);
      goto LAB_00136ce9;
    }
    sVar9 = 0x25232120;
    break;
  case 0x66:
    sVar9 = 0xd0b0908;
    break;
  case 0x67:
    sVar11 = emit_cum_binary(compiler,0x35333130,dst,dstw,src1,src1w,src2,src2w);
    return sVar11;
  case 0x68:
    sVar8 = ' ';
    goto LAB_00136bb2;
  case 0x69:
    sVar8 = '(';
    goto LAB_00136bb2;
  case 0x6a:
    sVar8 = '8';
LAB_00136bb2:
    sVar11 = emit_shift_with_flags(compiler,sVar8,set_flags,dst,dstw,src1,src1w,src2,src2w);
  default:
    goto switchD_00136a19_default;
  }
  sVar11 = emit_cum_binary(compiler,sVar9,dst,dstw,src1,src1w,src2,src2w);
switchD_00136a19_default:
  return sVar11;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_op2(struct sljit_compiler *compiler, sljit_s32 op,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_op2(compiler, op, dst, dstw, src1, src1w, src2, src2w));
	ADJUST_LOCAL_OFFSET(dst, dstw);
	ADJUST_LOCAL_OFFSET(src1, src1w);
	ADJUST_LOCAL_OFFSET(src2, src2w);

	CHECK_EXTRA_REGS(dst, dstw, (void)0);
	CHECK_EXTRA_REGS(src1, src1w, (void)0);
	CHECK_EXTRA_REGS(src2, src2w, (void)0);
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = op & SLJIT_I32_OP;
#endif

	if (dst == SLJIT_UNUSED && !HAS_FLAGS(op))
		return SLJIT_SUCCESS;

	switch (GET_OPCODE(op)) {
	case SLJIT_ADD:
		if (!HAS_FLAGS(op)) {
			if (emit_lea_binary(compiler, dst, dstw, src1, src1w, src2, src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}
		return emit_cum_binary(compiler, BINARY_OPCODE(ADD),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ADDC:
		return emit_cum_binary(compiler, BINARY_OPCODE(ADC),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUB:
		if (!HAS_FLAGS(op)) {
			if ((src2 & SLJIT_IMM) && emit_lea_binary(compiler, dst, dstw, src1, src1w, SLJIT_IMM, -src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}

		if (dst == SLJIT_UNUSED)
			return emit_cmp_binary(compiler, src1, src1w, src2, src2w);
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUBC:
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SBB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_MUL:
		return emit_mul(compiler, dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_AND:
		if (dst == SLJIT_UNUSED)
			return emit_test_binary(compiler, src1, src1w, src2, src2w);
		return emit_cum_binary(compiler, BINARY_OPCODE(AND),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_OR:
		return emit_cum_binary(compiler, BINARY_OPCODE(OR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_XOR:
		return emit_cum_binary(compiler, BINARY_OPCODE(XOR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SHL:
		return emit_shift_with_flags(compiler, SHL, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_LSHR:
		return emit_shift_with_flags(compiler, SHR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ASHR:
		return emit_shift_with_flags(compiler, SAR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	}

	return SLJIT_SUCCESS;
}